

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

Triangle * GetRandomTriangle(function<float_()> *value)

{
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  float *pfVar1;
  TriangleMesh *this;
  Allocator alloc;
  Triangle *pTVar2;
  int k;
  int iVar3;
  char *message;
  int j;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar12 [60];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  Vector3<float> VVar14;
  undefined8 uVar15;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  AssertionResult gtest_ar;
  Point3f v [3];
  Point3<float> local_114;
  _Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_108;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  int indices [3];
  int local_cc;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> triVec;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_88;
  _Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_68;
  _Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_48;
  
  v[2].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
      fVar5 = std::function<float_()>::operator()(value);
      pfVar1 = (float *)(v + lVar4);
      if ((iVar3 != 0) && (pfVar1 = &v[lVar4].super_Tuple3<pbrt::Point3,_float>.y, iVar3 != 1)) {
        pfVar1 = &v[lVar4].super_Tuple3<pbrt::Point3,_float>.z;
      }
      *pfVar1 = fVar5;
    }
  }
  auVar6._8_8_ = 0;
  auVar6._0_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.x;
  auVar6._4_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar10._4_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar6 = vsubps_avx(auVar6,auVar10);
  triVec.ptr._0_4_ =
       v[1].super_Tuple3<pbrt::Point3,_float>.z - v[0].super_Tuple3<pbrt::Point3,_float>.z;
  triVec.alloc.memoryResource = (memory_resource *)vmovlps_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_4_ = v[2].super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._4_4_ = v[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar6 = vsubps_avx(auVar7,auVar10);
  uVar15 = vmovlps_avx(auVar6);
  gtest_ar.success_ = SUB81(uVar15,0);
  gtest_ar._1_7_ = SUB87((ulong)uVar15 >> 8,0);
  gtest_ar.message_.ptr_._0_4_ =
       v[2].super_Tuple3<pbrt::Point3,_float>.z - v[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar9 = ZEXT856(auVar6._8_8_);
  auVar12 = (undefined1  [60])0x0;
  VVar14 = pbrt::Cross<float>((Vector3<float> *)&triVec,(Vector3<float> *)&gtest_ar);
  auVar11._0_4_ = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._4_60_ = auVar12;
  auVar8._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  auVar13._0_4_ =
       VVar14.super_Tuple3<pbrt::Vector3,_float>.x * VVar14.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar13._4_4_ =
       VVar14.super_Tuple3<pbrt::Vector3,_float>.y * VVar14.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar13._8_4_ = auVar9._0_4_ * auVar9._0_4_;
  auVar13._12_4_ = auVar9._4_4_ * auVar9._4_4_;
  auVar6 = vmovshdup_avx(auVar13);
  auVar6 = vfmadd231ss_fma(auVar6,auVar8._0_16_,auVar8._0_16_);
  auVar6 = vfmadd231ss_fma(auVar6,auVar11._0_16_,auVar11._0_16_);
  if (1e-20 <= auVar6._0_4_) {
    if (GetRandomTriangle(std::function<float()>)::identity == '\0') {
      iVar3 = __cxa_guard_acquire(&GetRandomTriangle(std::function<float()>)::identity);
      if (iVar3 != 0) {
        pbrt::Transform::Transform(&GetRandomTriangle::identity);
        __cxa_guard_release(&GetRandomTriangle(std::function<float()>)::identity);
      }
    }
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    this = (TriangleMesh *)operator_new(0x40);
    std::vector<int,std::allocator<int>>::vector<int*,void>
              ((vector<int,std::allocator<int>> *)&local_f0,indices,&local_cc,
               (allocator_type *)&triVec);
    uVar15 = 0x3225b2;
    std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
    vector<pbrt::Point3<float>*,void>
              ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)&local_108,v,
               &local_114,(allocator_type *)&gtest_ar);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_88;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_68;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_a8;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffea8;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar15;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffeac;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffeb0.ptr_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._1_7_ = gtest_ar._1_7_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = gtest_ar.success_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = gtest_ar.message_.ptr_._0_4_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = gtest_ar.message_.ptr_._4_4_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)v[0].super_Tuple3<pbrt::Point3,_float>._0_8_;
    pbrt::TriangleMesh::TriangleMesh
              (this,&GetRandomTriangle::identity,false,
               (vector<int,_std::allocator<int>_> *)&local_f0,
               (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_108,
               (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)&local_48,n,
               uv,faceIndices);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
              (&local_88);
    std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
              (&local_68);
    std::_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~_Vector_base
              (&local_48);
    std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
              (&local_108);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Triangle::CreateTriangles(&triVec,this,alloc);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"1","triVec.size()",(int *)&stack0xfffffffffffffea8,
               (unsigned_long *)&stack0xfffffffffffffeb0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xfffffffffffffeb0);
      if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
          (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffea8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                 ,0x94,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffea8,(Message *)&stack0xfffffffffffffeb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffea8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xfffffffffffffeb0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pTVar2 = (Triangle *)0x0;
    if ((short)(*(ulong *)CONCAT44(triVec.ptr._4_4_,triVec.ptr._0_4_) >> 0x30) == 4) {
      pTVar2 = (Triangle *)(*(ulong *)CONCAT44(triVec.ptr._4_4_,triVec.ptr._0_4_) & 0xffffffffffff);
    }
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
              (&triVec);
  }
  else {
    pTVar2 = (Triangle *)0x0;
  }
  return pTVar2;
}

Assistant:

Triangle *GetRandomTriangle(std::function<Float()> value) {
    // Triangle vertices
    Point3f v[3];
    for (int j = 0; j < 3; ++j)
        for (int k = 0; k < 3; ++k)
            v[j][k] = value();

    if (LengthSquared(Cross(v[1] - v[0], v[2] - v[0])) < 1e-20)
        // Don't into trouble with ~degenerate triangles.
        return nullptr;

    // Create the corresponding Triangle.
    static Transform identity;
    int indices[3] = {0, 1, 2};
    // Leaks...
    TriangleMesh *mesh = new TriangleMesh(identity, false, {indices, indices + 3},
                                          {v, v + 3}, {}, {}, {}, {});
    pstd::vector<ShapeHandle> triVec = Triangle::CreateTriangles(mesh, Allocator());
    EXPECT_EQ(1, triVec.size());
    return triVec[0].CastOrNullptr<Triangle>();
}